

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::ShaderSubroutine::APITest1::iterate(APITest1 *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  float fVar7;
  double dVar8;
  MessageBuilder local_850;
  MessageBuilder local_6d0;
  MessageBuilder local_550;
  MessageBuilder local_3d0;
  undefined4 local_24c;
  undefined1 local_248 [4];
  float epsilon;
  char *local_c8;
  char *pname_string;
  GLenum *pname;
  long lStack_b0;
  GLint min_value;
  GLint64 int64_value;
  GLint int_value;
  GLfloat float_value;
  GLdouble double_value;
  uint local_90;
  undefined4 uStack_8c;
  GLboolean bool_value;
  uint n_pname;
  uint n_pnames;
  anon_struct_24_3_17a86953 pnames [2];
  allocator<char> local_39;
  string local_38;
  long local_18;
  Functions *gl;
  APITest1 *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar2);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_shader_subroutine");
  if (!bVar1) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"GL_ARB_shader_subroutine is not supported.",&local_39);
    tcu::NotSupportedError::NotSupportedError(this_01,&local_38);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  memcpy(&n_pname,&DAT_032438d0,0x30);
  uStack_8c = 2;
  for (local_90 = 0; local_90 < 2; local_90 = local_90 + 1) {
    double_value._7_1_ = '\0';
    _int_value = 0.0;
    int64_value._4_4_ = 0.0;
    int64_value._0_4_ = 0;
    lStack_b0 = 0;
    pname._4_4_ = *(int *)&pnames[local_90].pname_string;
    pname_string = (char *)(&n_pname + (ulong)local_90 * 6);
    local_c8 = *(char **)(pnames + local_90);
    (**(code **)(local_18 + 0x798))(*(uint *)pname_string,(long)&double_value + 7);
    dVar3 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar3,"glGetBooleanv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x6b9);
    (**(code **)(local_18 + 0x7f8))(*(undefined4 *)pname_string,&int_value);
    dVar3 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar3,"glGetDoublev() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x6bc);
    (**(code **)(local_18 + 0x818))(*(undefined4 *)pname_string,(long)&int64_value + 4);
    dVar3 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar3,"glGetFloatv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x6bf);
    (**(code **)(local_18 + 0x868))(*(undefined4 *)pname_string,&int64_value);
    dVar3 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar3,"glGetIntegerv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x6c2);
    (**(code **)(local_18 + 0x850))(*(undefined4 *)pname_string,&stack0xffffffffffffff50);
    dVar3 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar3,"glGetInteger64v() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x6c5);
    if ((int)int64_value < pname._4_4_) {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_248,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_248,
                          (char (*) [39])"GL implementation reports a value of [");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&int64_value);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [17])"] for property [");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_c8);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [45])"], whereas the min max for the property is [");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)((long)&pname + 4));
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2af8aaf);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_248);
      this->m_has_test_passed = false;
    }
    local_24c = 0x3727c5ac;
    if ((((int)int64_value == 0) && (double_value._7_1_ == '\x01')) ||
       (((int)int64_value != 0 && (double_value._7_1_ != '\x01')))) {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_3d0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<(&local_3d0,(char (*) [24])"Invalid boolean value [");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uchar *)((long)&double_value + 7));
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [26])"] reported for property [");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_c8);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])"] (int value:[");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&int64_value);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2b86cfd);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3d0);
      this->m_has_test_passed = false;
    }
    dVar8 = de::abs<double>(_int_value - (double)(int)int64_value);
    if (9.999999747378752e-06 < dVar8) {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_550,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<(&local_550,(char (*) [23])"Invalid double value [");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(double *)&int_value);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [26])"] reported for property [");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_c8);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])"] (int value:[");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&int64_value);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2b86cfd);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_550);
      this->m_has_test_passed = false;
    }
    fVar7 = de::abs<float>(int64_value._4_4_ - (float)(int)int64_value);
    if (1e-05 < fVar7) {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_6d0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<(&local_6d0,(char (*) [22])"Invalid float value [");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(float *)((long)&int64_value + 4));
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [26])"] reported for property [");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_c8);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])"] (int value:[");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&int64_value);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2b86cfd);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_6d0);
      this->m_has_test_passed = false;
    }
    if (lStack_b0 != (int)int64_value) {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_850,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_850,(char (*) [31])"Invalid 64-bit integer value [");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(float *)((long)&int64_value + 4));
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [26])"] reported for property [");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_c8);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])"] (int value:[");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&int64_value);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2b86cfd);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_850);
      this->m_has_test_passed = false;
    }
  }
  if ((this->m_has_test_passed & 1U) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult APITest1::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Iterate over all pnames */
	const struct
	{
		glw::GLenum pname;
		const char* pname_string;
		glw::GLint  min_value;
	} pnames[] = { { GL_MAX_SUBROUTINES, "GL_MAX_SUBROUTINES", 256 },
				   { GL_MAX_SUBROUTINE_UNIFORM_LOCATIONS, "GL_MAX_SUBROUTINE_UNIFORM_LOCATIONS", 1024 } };
	const unsigned int n_pnames = sizeof(pnames) / sizeof(pnames[0]);

	for (unsigned int n_pname = 0; n_pname < n_pnames; ++n_pname)
	{
		glw::GLboolean	 bool_value   = GL_FALSE;
		glw::GLdouble	  double_value = 0.0;
		glw::GLfloat	   float_value  = 0.0f;
		glw::GLint		   int_value	= 0;
		glw::GLint64	   int64_value  = 0;
		const glw::GLint   min_value	= pnames[n_pname].min_value;
		const glw::GLenum& pname		= pnames[n_pname].pname;
		const char*		   pname_string = pnames[n_pname].pname_string;

		/* Retrieve the pname values */
		gl.getBooleanv(pname, &bool_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBooleanv() call failed.");

		gl.getDoublev(pname, &double_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetDoublev() call failed.");

		gl.getFloatv(pname, &float_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFloatv() call failed.");

		gl.getIntegerv(pname, &int_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed.");

		gl.getInteger64v(pname, &int64_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInteger64v() call failed.");

		/* Make sure the value reported meets the min max requirement */
		if (int_value < min_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "GL implementation reports a value of [" << int_value
							   << "]"
								  " for property ["
							   << pname_string << "]"
												  ", whereas the min max for the property is ["
							   << min_value << "]." << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		/* Verify the other getters reported valid values */
		const float epsilon = 1e-5f;

		if (((int_value == 0) && (bool_value == GL_TRUE)) || ((int_value != 0) && (bool_value != GL_TRUE)))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid boolean value [" << bool_value
							   << "]"
								  " reported for property ["
							   << pname_string << "]"
												  " (int value:["
							   << int_value << "])" << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		if (de::abs(double_value - (double)int_value) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid double value [" << double_value
							   << "]"
								  " reported for property ["
							   << pname_string << "]"
												  " (int value:["
							   << int_value << "])" << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		if (de::abs(float_value - (float)int_value) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid float value [" << float_value
							   << "]"
								  " reported for property ["
							   << pname_string << "]"
												  " (int value:["
							   << int_value << "])" << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		if (int64_value != int_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid 64-bit integer value [" << float_value
							   << "]"
								  " reported for property ["
							   << pname_string << "]"
												  " (int value:["
							   << int_value << "])" << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}
	} /* for (all pnames) */

	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}